

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

void __thiscall
cmCTestTestHandler::WriteTestResultHeader
          (cmCTestTestHandler *this,cmXMLWriter *xml,cmCTestTestResult *result)

{
  cmCTestTestResult *pcVar1;
  allocator<char> local_171;
  string local_170;
  string local_150;
  allocator<char> local_129;
  string local_128;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [8];
  string testPath;
  allocator<char> local_41;
  string local_40;
  cmCTestTestResult *local_20;
  cmCTestTestResult *result_local;
  cmXMLWriter *xml_local;
  cmCTestTestHandler *this_local;
  
  local_20 = result;
  result_local = (cmCTestTestResult *)xml;
  xml_local = (cmXMLWriter *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Test",&local_41);
  cmXMLWriter::StartElement(xml,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  if (local_20->Status == 9) {
    cmXMLWriter::Attribute<char[7]>((cmXMLWriter *)result_local,"Status",(char (*) [7])0xd10820);
  }
  else if (local_20->Status == 0) {
    cmXMLWriter::Attribute<char[7]>((cmXMLWriter *)result_local,"Status",(char (*) [7])"notrun");
  }
  else {
    cmXMLWriter::Attribute<char[7]>((cmXMLWriter *)result_local,"Status",(char (*) [7])0xd80950);
  }
  std::operator+(&local_98,&local_20->Path,"/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                 &local_98,&local_20->Name);
  std::__cxx11::string::~string((string *)&local_98);
  pcVar1 = result_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Name",&local_b9);
  cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)pcVar1,&local_b8,&local_20->Name);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  pcVar1 = result_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"Path",&local_e1);
  cmCTest::GetShortPathToFile(&local_108,(this->super_cmCTestGenericHandler).CTest,&local_20->Path);
  cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)pcVar1,&local_e0,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  pcVar1 = result_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"FullName",&local_129);
  cmCTest::GetShortPathToFile
            (&local_150,(this->super_cmCTestGenericHandler).CTest,(string *)local_78);
  cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)pcVar1,&local_128,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  pcVar1 = result_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"FullCommandLine",&local_171);
  cmXMLWriter::Element<std::__cxx11::string>
            ((cmXMLWriter *)pcVar1,&local_170,&local_20->FullCommandLine);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  std::__cxx11::string::~string((string *)local_78);
  return;
}

Assistant:

void cmCTestTestHandler::WriteTestResultHeader(cmXMLWriter& xml,
                                               cmCTestTestResult const& result)
{
  xml.StartElement("Test");
  if (result.Status == cmCTestTestHandler::COMPLETED) {
    xml.Attribute("Status", "passed");
  } else if (result.Status == cmCTestTestHandler::NOT_RUN) {
    xml.Attribute("Status", "notrun");
  } else {
    xml.Attribute("Status", "failed");
  }
  std::string testPath = result.Path + "/" + result.Name;
  xml.Element("Name", result.Name);
  xml.Element("Path", this->CTest->GetShortPathToFile(result.Path));
  xml.Element("FullName", this->CTest->GetShortPathToFile(testPath));
  xml.Element("FullCommandLine", result.FullCommandLine);
}